

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

void matchit::impl::PatternTraits<matchit::impl::Id<bool>_>::processIdImpl
               (Id<bool> *idPat,int32_t depth,IdProcess idProcess)

{
  IdBlock<bool> *pIVar1;
  IdBlockBase<bool> *this;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_a;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_9;
  
  if (idProcess == kCONFIRM) {
    this = &(*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<bool>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>_&>
              ::_S_vtable._M_arr
              [(idPat->mBlock).
               super__Variant_base<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>.
               super__Move_assign_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
               .super__Move_ctor_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
               .super__Copy_ctor_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
               .
               super__Variant_storage_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
               ._M_index]._M_data)(&local_9,&idPat->mBlock)->super_IdBlockBase<bool>;
    IdBlockBase<bool>::confirm(this,depth);
  }
  else if (idProcess == kCANCEL) {
    pIVar1 = (*std::__detail::__variant::
               __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<bool>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O3/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>_&>
               ::_S_vtable._M_arr
               [(idPat->mBlock).
                super__Variant_base<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>.
                super__Move_assign_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                .
                super__Copy_assign_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                .
                super__Move_ctor_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                .
                super__Copy_ctor_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                .
                super__Variant_storage_alias<matchit::impl::IdBlock<bool>,_matchit::impl::IdBlock<bool>_*>
                ._M_index]._M_data)(&local_a,&idPat->mBlock);
    if (depth <= (pIVar1->super_IdBlockBase<bool>).mDepth) {
      (pIVar1->super_IdBlockBase<bool>).mVariant.
      super__Variant_base<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Move_assign_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Copy_assign_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Move_ctor_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Copy_ctor_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Variant_storage_alias<std::monostate,_bool,_bool_*,_const_bool_*>._M_u =
           (_Variadic_union<std::monostate,_bool,_bool_*,_const_bool_*>)0x0;
      (pIVar1->super_IdBlockBase<bool>).mVariant.
      super__Variant_base<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Move_assign_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Copy_assign_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Move_ctor_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Copy_ctor_alias<std::monostate,_bool,_bool_*,_const_bool_*>.
      super__Variant_storage_alias<std::monostate,_bool,_bool_*,_const_bool_*>._M_index = '\0';
      (pIVar1->super_IdBlockBase<bool>).mDepth = depth;
    }
  }
  return;
}

Assistant:

constexpr static void processIdImpl(Id<Type> const &idPat, int32_t depth,
                                                IdProcess idProcess)
            {
                switch (idProcess)
                {
                case IdProcess::kCANCEL:
                    idPat.reset(depth);
                    break;

                case IdProcess::kCONFIRM:
                    idPat.confirm(depth);
                    break;
                }
            }